

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_timeout.cpp
# Opt level: O2

void cppcms::impl::set_send_timeout(stream_socket *sock,int seconds)

{
  int iVar1;
  system_error *this;
  error_code eVar2;
  error_code e;
  
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  set_send_timeout(sock,seconds,&e);
  iVar1 = e._M_value;
  if (e._M_value == 0) {
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x40);
  eVar2._4_4_ = 0;
  eVar2._M_value = iVar1;
  eVar2._M_cat = e._M_cat;
  booster::system::system_error::system_error(this,eVar2);
  __cxa_throw(this,&booster::system::system_error::typeinfo,
              booster::system::system_error::~system_error);
}

Assistant:

void set_send_timeout(booster::aio::stream_socket &sock,int seconds)
{
	booster::system::error_code e;
	set_send_timeout(sock,seconds,e);
	if(e) {
		throw booster::system::system_error(e);
	}
}